

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O2

bool __thiscall JsonModelSerialiser::loadModel(JsonModelSerialiser *this,QByteArray *source)

{
  undefined1 uVar1;
  QTextStream reader;
  QString loadString;
  
  QTextStream::QTextStream(&reader,source,0x11);
  QTextStream::readAll();
  uVar1 = (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).
                                 super_AbstractModelSerialiser + 200))(this,&loadString);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&loadString.d);
  QTextStream::~QTextStream(&reader);
  return (bool)uVar1;
}

Assistant:

bool JsonModelSerialiser::loadModel(const QByteArray &source)
{
    QTextStream reader(source, QIODevice::ReadOnly | QIODevice::Text);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    reader.setCodec(textCodec());
#endif
    QString loadString = reader.readAll();
    return loadModel(&loadString);
}